

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O0

void __thiscall
gl4cts::DirectStateAccess::Framebuffers::ClearNamedFramebufferErrorsTest::Clean
          (ClearNamedFramebufferErrorsTest *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  ClearNamedFramebufferErrorsTest *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  if (this->m_fbo_valid != 0) {
    (**(code **)(lVar3 + 0x440))(1,&this->m_fbo_valid);
    this->m_fbo_valid = 0;
  }
  if (this->m_rbo_color != 0) {
    (**(code **)(lVar3 + 0x460))(1,&this->m_rbo_color);
    this->m_rbo_color = 0;
  }
  if (this->m_rbo_depth_stencil != 0) {
    (**(code **)(lVar3 + 0x460))(1,&this->m_rbo_depth_stencil);
    this->m_rbo_depth_stencil = 0;
  }
  this->m_fbo_invalid = 0;
  do {
    iVar1 = (**(code **)(lVar3 + 0x800))();
  } while (iVar1 != 0);
  return;
}

Assistant:

void ClearNamedFramebufferErrorsTest::Clean()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Release GL objects. */
	if (m_fbo_valid)
	{
		gl.deleteFramebuffers(1, &m_fbo_valid);
		m_fbo_valid = 0;
	}

	if (m_rbo_color)
	{
		gl.deleteRenderbuffers(1, &m_rbo_color);
		m_rbo_color = 0;
	}

	if (m_rbo_depth_stencil)
	{
		gl.deleteRenderbuffers(1, &m_rbo_depth_stencil);
		m_rbo_depth_stencil = 0;
	}

	/* Set initial values - all test shall have the same environment. */
	m_fbo_invalid = 0;

	/* Errors clean up. */
	while (gl.getError())
		;
}